

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

seconds __thiscall CConnman::GetMaxOutboundTimeLeftInCycle_(CConnman *this)

{
  long lVar1;
  strong_ordering sVar2;
  bool bVar3;
  rep rVar4;
  duration<long,_std::ratio<1L,_1L>_> *in_RDI;
  long in_FS_OFFSET;
  duration<long,_std::ratio<1L,_1L>_> now;
  seconds cycleEndTime;
  __unspec *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  duration<long,_std::ratio<1L,_1L>_> *__lhs;
  rep local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),(char *)in_RDI,
             (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(AnnotatedMixin<std::mutex> *)0x22073d)
  ;
  if (in_RDI[9].__r == 0) {
    local_10 = (rep)s<(char)48>();
  }
  else {
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                      ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffffb8);
    if (rVar4 == 0) {
      local_10 = 0x15180;
    }
    else {
      std::chrono::operator+
                ((duration<long,_std::ratio<1L,_1L>_> *)
                 CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),in_RDI);
      GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
      sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<1L,_1L>_>
                        (__lhs,(duration<long,_std::ratio<1L,_1L>_> *)
                               CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      std::__cmp_cat::__unspec::__unspec(in_stack_ffffffffffffffb8,(__unspec *)0x2207bf);
      bVar3 = std::operator<(sVar2._M_value);
      if (bVar3) {
        local_10 = (rep)s<(char)48>();
      }
      else {
        local_10 = (rep)std::chrono::operator-
                                  ((duration<long,_std::ratio<1L,_1L>_> *)
                                   CONCAT17(sVar2._M_value,in_stack_ffffffffffffffc8),in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (seconds)local_10;
}

Assistant:

std::chrono::seconds CConnman::GetMaxOutboundTimeLeftInCycle_() const
{
    AssertLockHeld(m_total_bytes_sent_mutex);

    if (nMaxOutboundLimit == 0)
        return 0s;

    if (nMaxOutboundCycleStartTime.count() == 0)
        return MAX_UPLOAD_TIMEFRAME;

    const std::chrono::seconds cycleEndTime = nMaxOutboundCycleStartTime + MAX_UPLOAD_TIMEFRAME;
    const auto now = GetTime<std::chrono::seconds>();
    return (cycleEndTime < now) ? 0s : cycleEndTime - now;
}